

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O2

string * squareToAlgebraic_abi_cxx11_(string *__return_storage_ptr__,byte square)

{
  string second;
  string first;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  local_30._M_string_length = 0;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  local_50.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)&local_30);
  if (square < 0x40) {
    std::__cxx11::string::assign((char *)&local_50);
  }
  std::operator+(__return_storage_ptr__,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string squareToAlgebraic(const byte square) {
  std::string first;
  std::string second;
  switch(square % 8) {
    case 0:
      first = "a";
      break;
    case 1:
      first = "b";
      break;
    case 2:
      first = "c";
      break;
    case 3:
      first = "d";
      break;
    case 4:
      first = "e";
      break;
    case 5:
      first = "f";
      break;
    case 6:
      first = "g";
      break;
    case 7:
      first = "h";
      break;
  }

  switch(square / 8) {
    case 0:
      second = "8";
      break;
    case 1:
      second = "7";
      break;
    case 2:
      second = "6";
      break;
    case 3:
      second = "5";
      break;
    case 4:
      second = "4";
      break;
    case 5:
      second = "3";
      break;
    case 6:
      second = "2";
      break;
    case 7:
      second = "1";
      break;
  }

  return first + second;
}